

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall QString::insert(QString *this,qsizetype i,QChar *unicode,qsizetype size)

{
  Data *pDVar1;
  char16_t *pcVar2;
  long in_FS_OFFSET;
  QVarLengthArray<QChar,_256LL> copy;
  QVarLengthArray<QChar,_256LL> local_248;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < size && -1 < i) {
    pDVar1 = (this->d).d;
    if ((pDVar1 != (Data *)0x0) &&
       ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
      pcVar2 = (this->d).ptr;
      if ((QChar *)pcVar2 == (QChar *)0x0) {
        pcVar2 = L"";
      }
      if ((pcVar2 <= unicode) && (unicode < (QChar *)pcVar2 + (this->d).size)) {
        memset(&local_248,0xaa,0x218);
        QVarLengthArray<QChar,_256LL>::QVarLengthArray<const_QChar_*,_true>
                  (&local_248,unicode,unicode + size);
        insert(this,i,(QChar *)local_248.super_QVLABase<QChar>.super_QVLABaseBase.ptr,size);
        QVarLengthArray<QChar,_256LL>::~QVarLengthArray(&local_248);
        goto LAB_002ef459;
      }
    }
    local_248.super_QVLABase<QChar>.super_QVLABaseBase.a = size;
    local_248.super_QVLABase<QChar>.super_QVLABaseBase.s = (qsizetype)unicode;
    insert_helper<QStringView>(this,i,(QStringView *)&local_248);
  }
LAB_002ef459:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString& QString::insert(qsizetype i, const QChar *unicode, qsizetype size)
{
    if (i < 0 || size <= 0)
        return *this;

    // In case when data points into "this"
    if (!d->needsDetach() && QtPrivate::q_points_into_range(unicode, *this)) {
        QVarLengthArray copy(unicode, unicode + size);
        insert(i, copy.data(), size);
    } else {
        insert_helper(*this, i, QStringView(unicode, size));
    }

    return *this;
}